

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

void __thiscall sector_t::GetSpecial(sector_t *this,secspecial_t *spec)

{
  secspecial_t *spec_local;
  sector_t *this_local;
  
  spec->special = this->special;
  spec->damageamount = this->damageamount;
  FNameNoInit::operator=(&spec->damagetype,&this->damagetype);
  spec->damageinterval = this->damageinterval;
  spec->leakydamage = this->leakydamage;
  spec->Flags = this->Flags & 0x7b0;
  return;
}

Assistant:

void sector_t::GetSpecial(secspecial_t *spec)
{
	spec->special = special;
	spec->damageamount = damageamount;
	spec->damagetype = damagetype;
	spec->damageinterval = damageinterval;
	spec->leakydamage = leakydamage;
	spec->Flags = Flags & SECF_SPECIALFLAGS;
}